

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O3

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  byte bVar1;
  handle hVar2;
  object oVar3;
  int iVar4;
  object *poVar5;
  long *plVar6;
  size_t sVar7;
  void *__dest;
  internals *piVar8;
  long lVar9;
  PyObject *pPVar10;
  PyTypeObject *pPVar11;
  error_already_set *this;
  key_type **pppcVar12;
  size_type *psVar13;
  object *object;
  PyObject *pPVar14;
  PyTypeObject *type;
  object module;
  tuple bases;
  object ht_qualname;
  object name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> full_name;
  handle local_110;
  handle local_108;
  allocator local_f9;
  undefined1 local_f8 [32];
  object local_d8;
  handle local_d0;
  accessor<pybind11::detail::accessor_policies::str_attr> local_c8;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  
  local_d8.super_handle.m_ptr = (handle)PyUnicode_FromString(rec->name);
  if (local_d8.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_d8.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_d8.super_handle.m_ptr)->ob_refcnt + 1;
  }
  pPVar14 = (rec->scope).m_ptr;
  local_d0.m_ptr = (PyObject *)local_d8.super_handle.m_ptr;
  if (pPVar14 == (PyObject *)0x0) {
    local_110.m_ptr = (PyObject *)0x0;
LAB_0011a7c2:
    std::__cxx11::string::string((string *)&local_c8,rec->name,(allocator *)local_f8);
  }
  else {
    iVar4 = PyObject_HasAttrString(pPVar14,"__qualname__");
    if (iVar4 == 1) {
      local_c8.obj.m_ptr = (rec->scope).m_ptr;
      local_c8.key = "__qualname__";
      local_c8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_c8);
      local_f8._0_8_ = PyUnicode_FromFormat("%U.%U",(poVar5->super_handle).m_ptr,local_d0.m_ptr);
      pybind11::object::operator=(&local_d8,(object *)local_f8);
      pybind11::object::~object((object *)local_f8);
      pybind11::object::~object(&local_c8.cache);
    }
    pPVar14 = (rec->scope).m_ptr;
    local_110.m_ptr = (PyObject *)0x0;
    if (pPVar14 == (PyObject *)0x0) goto LAB_0011a7c2;
    iVar4 = PyObject_HasAttrString(pPVar14,"__module__");
    if (iVar4 == 1) {
      local_c8.obj.m_ptr = (rec->scope).m_ptr;
      local_c8.key = "__module__";
      local_c8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_c8);
LAB_0011a72c:
      local_f8._0_8_ = (poVar5->super_handle).m_ptr;
      if ((PyObject *)local_f8._0_8_ != (PyObject *)0x0) {
        ((PyObject *)local_f8._0_8_)->ob_refcnt = ((PyObject *)local_f8._0_8_)->ob_refcnt + 1;
      }
      pybind11::object::operator=((object *)&local_110,(object *)local_f8);
      pybind11::object::~object((object *)local_f8);
      pybind11::object::~object(&local_c8.cache);
    }
    else {
      iVar4 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar4 == 1) {
        local_c8.obj.m_ptr = (rec->scope).m_ptr;
        local_c8.key = "__name__";
        local_c8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
        poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_c8);
        goto LAB_0011a72c;
      }
    }
    if (local_110.m_ptr == (PyObject *)0x0) goto LAB_0011a7c2;
    str::str((str *)&local_88,(object *)&local_110);
    cast<std::__cxx11::string>(&local_a8,(pybind11 *)&local_88,object);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    pPVar14 = (PyObject *)(plVar6 + 2);
    if ((PyObject *)*plVar6 == pPVar14) {
      local_f8._16_8_ = pPVar14->ob_refcnt;
      local_f8._24_8_ = plVar6[3];
      local_f8._0_8_ = (PyObject *)(local_f8 + 0x10);
    }
    else {
      local_f8._16_8_ = pPVar14->ob_refcnt;
      local_f8._0_8_ = (PyObject *)*plVar6;
    }
    local_f8._8_8_ = plVar6[1];
    *plVar6 = (long)pPVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_f8);
    local_c8._0_8_ = &local_c8.key;
    pppcVar12 = (key_type **)(plVar6 + 2);
    if ((key_type **)*plVar6 == pppcVar12) {
      local_c8.key = (key_type)*pppcVar12;
      local_c8.cache.super_handle.m_ptr = (handle)plVar6[3];
    }
    else {
      local_c8.key = (key_type)*pppcVar12;
      local_c8._0_8_ = (key_type **)*plVar6;
    }
    local_c8.obj.m_ptr = (PyObject *)plVar6[1];
    *plVar6 = (long)pppcVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((PyObject *)local_f8._0_8_ != (PyObject *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    pybind11::object::~object((object *)&local_88);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar7 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar7 + 1);
    memcpy(__dest,rec->doc,sVar7 + 1);
  }
  piVar8 = get_internals();
  tuple::tuple((tuple *)&local_108,&(rec->bases).super_object);
  lVar9 = PyTuple_Size(local_108.m_ptr);
  if (lVar9 == 0) {
    pPVar14 = piVar8->instance_base;
  }
  else {
    local_f8._8_8_ = local_108.m_ptr;
    local_f8._16_8_ = 0;
    local_f8._24_8_ = (PyObject *)0x0;
    poVar5 = accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                       ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_f8);
    pPVar14 = (poVar5->super_handle).m_ptr;
    pybind11::object::~object((object *)(local_f8 + 0x18));
  }
  pPVar11 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar11 == (PyTypeObject *)0x0) {
    pPVar11 = piVar8->default_metaclass;
  }
  pPVar10 = (*pPVar11->tp_alloc)(pPVar11,0);
  hVar2.m_ptr = local_d0.m_ptr;
  oVar3.super_handle.m_ptr = local_d8.super_handle.m_ptr;
  if (pPVar10 == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_a8,rec->name,(allocator *)&local_88);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_f8._0_8_ = *plVar6;
    pPVar14 = (PyObject *)(plVar6 + 2);
    if ((PyObject *)local_f8._0_8_ == pPVar14) {
      local_f8._16_8_ = pPVar14->ob_refcnt;
      local_f8._24_8_ = plVar6[3];
      local_f8._0_8_ = (PyObject *)(local_f8 + 0x10);
    }
    else {
      local_f8._16_8_ = pPVar14->ob_refcnt;
    }
    local_f8._8_8_ = plVar6[1];
    *plVar6 = (long)pPVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pybind11_fail((string *)local_f8);
  }
  local_d0.m_ptr = (PyObject *)0x0;
  pPVar10[0x35].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  local_d8.super_handle.m_ptr = (handle)(PyObject *)0x0;
  pPVar10[0x36].ob_refcnt = (Py_ssize_t)oVar3.super_handle.m_ptr;
  pPVar11 = (PyTypeObject *)strdup((char *)local_c8._0_8_);
  pPVar10[1].ob_type = pPVar11;
  pPVar10[0xb].ob_refcnt = (Py_ssize_t)__dest;
  if (pPVar14 != (PyObject *)0x0) {
    pPVar14->ob_refcnt = pPVar14->ob_refcnt + 1;
  }
  pPVar10[0x10].ob_refcnt = (Py_ssize_t)pPVar14;
  pPVar10[2].ob_refcnt = 0x38;
  lVar9 = PyTuple_Size(local_108.m_ptr);
  hVar2.m_ptr = local_108.m_ptr;
  if (lVar9 != 0) {
    local_108.m_ptr = (PyObject *)0x0;
    pPVar10[0x15].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  }
  pPVar10[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  pPVar10[6].ob_refcnt = (Py_ssize_t)&pPVar10[0x1b].ob_type;
  pPVar10[6].ob_type = (PyTypeObject *)(pPVar10 + 0x2f);
  pPVar10[7].ob_refcnt = (Py_ssize_t)&pPVar10[0x2d].ob_type;
  pPVar11 = pPVar10[10].ob_type;
  pPVar10[10].ob_type = (PyTypeObject *)((ulong)pPVar11 | 0x600);
  bVar1 = rec->field_0x58;
  if ((bVar1 & 2) != 0) {
    pPVar10[10].ob_type = (PyTypeObject *)((ulong)pPVar11 | 0x4600);
    pPVar10[0x12].ob_refcnt = pPVar10[2].ob_refcnt;
    pPVar10[2].ob_refcnt = pPVar10[2].ob_refcnt + 8;
    pPVar10[0xb].ob_type = (PyTypeObject *)pybind11_traverse;
    pPVar10[0xc].ob_refcnt = (Py_ssize_t)pybind11_clear;
    pPVar10[0xf].ob_type = (PyTypeObject *)enable_dynamic_attributes(_heaptypeobject*)::getset;
    bVar1 = rec->field_0x58;
  }
  if ((bVar1 & 4) != 0) {
    pPVar10[10].ob_refcnt = (Py_ssize_t)(pPVar10 + 0x34);
    pPVar10[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    pPVar10[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  iVar4 = PyType_Ready(pPVar10);
  if (iVar4 < 0) {
    std::__cxx11::string::string(local_48,rec->name,&local_f9);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_48);
    local_88._M_dataplus._M_p = (pointer)*plVar6;
    psVar13 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_88._M_dataplus._M_p == psVar13) {
      local_88.field_2._M_allocated_capacity = *psVar13;
      local_88.field_2._8_8_ = plVar6[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar13;
    }
    local_88._M_string_length = plVar6[1];
    *plVar6 = (long)psVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    error_string_abi_cxx11_();
    std::operator+(&local_a8,&local_88,&local_68);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_f8._0_8_ = *plVar6;
    pPVar14 = (PyObject *)(plVar6 + 2);
    if ((PyObject *)local_f8._0_8_ == pPVar14) {
      local_f8._16_8_ = pPVar14->ob_refcnt;
      local_f8._24_8_ = plVar6[3];
      local_f8._0_8_ = (PyObject *)(local_f8 + 0x10);
    }
    else {
      local_f8._16_8_ = pPVar14->ob_refcnt;
    }
    local_f8._8_8_ = plVar6[1];
    *plVar6 = (long)pPVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pybind11_fail((string *)local_f8);
  }
  if (((rec->field_0x58 & 2) == 0) != (((ulong)pPVar10[10].ob_type & 0x4000) == 0)) {
    __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/class_support.h"
                  ,0x22e,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  pPVar14 = (rec->scope).m_ptr;
  if (pPVar14 != (PyObject *)0x0) {
    iVar4 = PyObject_SetAttrString(pPVar14,rec->name,pPVar10);
    if (iVar4 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      goto LAB_0011ac3d;
    }
  }
  if (local_110.m_ptr != (PyObject *)0x0) {
    iVar4 = PyObject_SetAttrString(pPVar10,"__module__");
    if (iVar4 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
LAB_0011ac3d:
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  pybind11::object::~object((object *)&local_108);
  if ((key_type *)local_c8._0_8_ != &local_c8.key) {
    operator_delete((void *)local_c8._0_8_,(long)local_c8.key + 1);
  }
  pybind11::object::~object((object *)&local_110);
  pybind11::object::~object(&local_d8);
  pybind11::object::~object((object *)&local_d0);
  return pPVar10;
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    auto ht_qualname = name;
    if (rec.scope && hasattr(rec.scope, "__qualname__")) {
        ht_qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
    }
#endif

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

#if !defined(PYPY_VERSION)
    const auto full_name = module ? str(module).cast<std::string>() + "." + rec.name
                                  : std::string(rec.name);
#else
    const auto full_name = std::string(rec.name);
#endif

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    heap_type->ht_qualname = ht_qualname.release().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = strdup(full_name.c_str());
    type->tp_doc = tp_doc;
    type->tp_base = (PyTypeObject *) handle(base).inc_ref().ptr();
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    return (PyObject *) type;
}